

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::anon_unknown_19::makeSharedVerticeDistinct
               (VertexPacket **packet,
               set<rr::VertexPacket_*,_std::less<void_*>,_std::allocator<rr::VertexPacket_*>_>
               *vertices,VertexPacketAllocator *vpalloc)

{
  long lVar1;
  bool bVar2;
  VertexPacket *pVVar3;
  size_t sVar4;
  ulong local_50;
  size_t outputNdx;
  VertexPacket *newPacket;
  _Self local_30;
  _Self local_28;
  VertexPacketAllocator *local_20;
  VertexPacketAllocator *vpalloc_local;
  set<rr::VertexPacket_*,_std::less<void_*>,_std::allocator<rr::VertexPacket_*>_> *vertices_local;
  VertexPacket **packet_local;
  
  local_20 = vpalloc;
  vpalloc_local = (VertexPacketAllocator *)vertices;
  vertices_local =
       (set<rr::VertexPacket_*,_std::less<void_*>,_std::allocator<rr::VertexPacket_*>_> *)packet;
  local_28._M_node =
       (_Base_ptr)
       std::set<rr::VertexPacket_*,_std::less<void_*>,_std::allocator<rr::VertexPacket_*>_>::find
                 (vertices,packet);
  local_30._M_node =
       (_Base_ptr)
       std::set<rr::VertexPacket_*,_std::less<void_*>,_std::allocator<rr::VertexPacket_*>_>::end
                 ((set<rr::VertexPacket_*,_std::less<void_*>,_std::allocator<rr::VertexPacket_*>_> *
                  )vpalloc_local);
  bVar2 = std::operator==(&local_28,&local_30);
  if (bVar2) {
    std::set<rr::VertexPacket_*,_std::less<void_*>,_std::allocator<rr::VertexPacket_*>_>::insert
              ((set<rr::VertexPacket_*,_std::less<void_*>,_std::allocator<rr::VertexPacket_*>_> *)
               vpalloc_local,(value_type *)vertices_local);
  }
  else {
    pVVar3 = VertexPacketAllocator::alloc(local_20);
    lVar1 = *(long *)&(vertices_local->_M_t)._M_impl;
    *(undefined8 *)(pVVar3->position).m_data = *(undefined8 *)(lVar1 + 8);
    *(undefined8 *)((pVVar3->position).m_data + 2) = *(undefined8 *)(lVar1 + 0x10);
    pVVar3->pointSize = *(float *)(*(long *)&(vertices_local->_M_t)._M_impl + 0x18);
    pVVar3->primitiveID = *(int *)(*(long *)&(vertices_local->_M_t)._M_impl + 0x1c);
    local_50 = 0;
    while( true ) {
      sVar4 = VertexPacketAllocator::getNumVertexOutputs(local_20);
      if (sVar4 <= local_50) break;
      GenericVec4::operator=
                (pVVar3->outputs + local_50,
                 (GenericVec4 *)(*(long *)&(vertices_local->_M_t)._M_impl + 0x20 + local_50 * 0x10))
      ;
      local_50 = local_50 + 1;
    }
    *(VertexPacket **)&(vertices_local->_M_t)._M_impl = pVVar3;
  }
  return;
}

Assistant:

void makeSharedVerticeDistinct (VertexPacket*& packet, std::set<VertexPacket*, std::less<void*> >& vertices, VertexPacketAllocator& vpalloc)
{
	// distinct
	if (vertices.find(packet) == vertices.end())
	{
		vertices.insert(packet);
	}
	else
	{
		VertexPacket* newPacket = vpalloc.alloc();

		// copy packet output values
		newPacket->position		= packet->position;
		newPacket->pointSize	= packet->pointSize;
		newPacket->primitiveID	= packet->primitiveID;

		for (size_t outputNdx = 0; outputNdx < vpalloc.getNumVertexOutputs(); ++outputNdx)
			newPacket->outputs[outputNdx] = packet->outputs[outputNdx];

		// no need to insert new packet to "vertices" as newPacket is unique
		packet = newPacket;
	}
}